

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O2

void __thiscall RVO::RVOSimulator::doStep(RVOSimulator *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  int i;
  long lVar3;
  
  KdTree::buildAgentTree(this->kdTree_);
  lVar3 = 0;
  while( true ) {
    ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppAVar2 - (long)ppAVar1) >> 3) <= lVar3) break;
    Agent::computeNeighbors(ppAVar1[lVar3]);
    Agent::computeNewVelocity
              ((this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar3]);
    lVar3 = lVar3 + 1;
  }
  for (lVar3 = 0; lVar3 < (int)((ulong)((long)ppAVar2 - (long)ppAVar1) >> 3); lVar3 = lVar3 + 1) {
    Agent::update(ppAVar1[lVar3]);
    ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void RVOSimulator::doStep()
	{
		kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->computeNeighbors();
			agents_[i]->computeNewVelocity();
		}

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->update();
		}

		globalTime_ += timeStep_;
	}